

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_offsetof(lua_State *L)

{
  uint uVar1;
  CTState *cts;
  TValue *pTVar2;
  CTypeID id;
  GCstr *name;
  CType *pCVar3;
  uint uVar4;
  int iVar5;
  CTSize ofs;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  iVar5 = 0;
  id = ffi_checkctype(L,cts,(TValue *)0x0);
  name = lj_lib_checkstr(L,2);
  pCVar3 = lj_ctype_rawref(cts,id);
  if (((pCVar3->info & 0xf0000000) == 0x10000000) && (pCVar3->size != 0xffffffff)) {
    iVar5 = 0;
    pCVar3 = lj_ctype_getfieldq(cts,pCVar3,name,&ofs,(CTInfo *)0x0);
    if (pCVar3 != (CType *)0x0) {
      L->top[-1].n = (double)(int)ofs;
      uVar1 = pCVar3->info;
      uVar4 = uVar1 >> 0x1c;
      if (uVar4 == 9) {
        iVar5 = 1;
      }
      else if (uVar4 == 10) {
        pTVar2 = L->top;
        L->top = pTVar2 + 1;
        pTVar2->n = (double)(uVar1 & 0x7f);
        pTVar2 = L->top;
        L->top = pTVar2 + 1;
        pTVar2->n = (double)(pCVar3->info >> 8 & 0x7f);
        iVar5 = 3;
      }
    }
  }
  return iVar5;
}

Assistant:

LJLIB_CF(ffi_offsetof)	LJLIB_REC(ffi_xof FF_ffi_offsetof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  GCstr *name = lj_lib_checkstr(L, 2);
  CType *ct = lj_ctype_rawref(cts, id);
  CTSize ofs;
  if (ctype_isstruct(ct->info) && ct->size != CTSIZE_INVALID) {
    CType *fct = lj_ctype_getfield(cts, ct, name, &ofs);
    if (fct) {
      setintV(L->top-1, ofs);
      if (ctype_isfield(fct->info)) {
	return 1;
      } else if (ctype_isbitfield(fct->info)) {
	setintV(L->top++, ctype_bitpos(fct->info));
	setintV(L->top++, ctype_bitbsz(fct->info));
	return 3;
      }
    }
  }
  return 0;
}